

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O2

planck_unit_result_t
planck_unit_assert_int_are_not_equal
          (planck_unit_test_t *state,int32_t expected,int32_t actual,int line,char *file)

{
  planck_unit_result_t pVar1;
  int iVar2;
  char *__s;
  int32_t actual_local;
  int32_t expected_local;
  
  actual_local = actual;
  expected_local = expected;
  iVar2 = planck_unit_check_int_space("expected not int %ld, got %ld",&expected_local,&actual_local)
  ;
  state->allocated_message = '\x01';
  __s = (char *)malloc((long)iVar2);
  if ((iVar2 != 0) && (__s != (char *)0x0)) {
    sprintf(__s,"expected not int %ld, got %ld",(ulong)(uint)expected,(ulong)(uint)actual);
    pVar1 = planck_unit_assert_true(state,(uint)(expected != actual),line,file,__s);
    return pVar1;
  }
  free(__s);
  printf("out of memory");
  fflush(_stdout);
  exit(-1);
}

Assistant:

planck_unit_result_t
planck_unit_assert_int_are_not_equal(
	planck_unit_test_t	*state,
	int32_t					expected,
	int32_t					actual,
	int					line,
	const char			*file
) {
	const char	*message;
	int			message_size;
	char		*buffer;

	message						= "expected not int %ld, got %ld";

	message_size				= planck_unit_check_int_space(message, &expected, &actual);
	state->allocated_message	= 1;
	buffer						= malloc(message_size);

	if ((NULL == buffer) || !message_size) {
		free(buffer);
		PLANCK_UNIT_PRINT_STR("out of memory");
		exit(-1);
	}

	sprintf(buffer, message, expected, actual);

	return planck_unit_assert_true(state, expected != actual, line, file, buffer);
}